

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_utxo.cpp
# Opt level: O1

vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> * __thiscall
cfd::CoinSelection::SelectCoins
          (vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *__return_storage_ptr__,CoinSelection *this
          ,AmountMap *map_target_value,vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *utxos,
          UtxoFilter *filter,CoinSelectionOption *option_params,Amount *tx_fee_value,
          AmountMap *map_select_value,Amount *utxo_fee_value,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
          *map_searched_bnb,AmountMap *map_utxo_fee_value)

{
  _Rb_tree_node_base *p_Var1;
  uint64_t uVar2;
  _Base_ptr __n;
  pointer pUVar3;
  char cVar4;
  int iVar5;
  iterator iVar6;
  _Base_ptr p_Var7;
  mapped_type *pmVar8;
  mapped_type *pmVar9;
  CfdException *pCVar10;
  pointer pUVar11;
  bool bVar12;
  vector<unsigned_char,_std::allocator<unsigned_char>_> asset_byte;
  AmountMap work_selected_values;
  AmountMap work_map_utxo_fee_value;
  AmountMap work_target_values;
  ConfidentialAssetId fee_asset;
  anon_class_168_9_d2d4f853 coin_selection_function;
  int64_t target_value;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>_>_>_>
  asset_utxos;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  work_searched_bnb;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> work_utxos;
  Amount tx_fee_out;
  Amount work_utxo_fee;
  key_type local_2b0;
  undefined1 local_290 [32];
  _Base_ptr local_270;
  size_t local_268;
  _Rb_tree_node_base *local_260;
  undefined1 local_258 [8];
  Utxo **ppUStack_250;
  _Base_ptr local_248;
  _Base_ptr local_240;
  _Base_ptr local_238;
  size_t local_230;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
  local_228;
  ConfidentialAssetId local_1f8;
  undefined1 local_1d0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c0;
  uint64_t local_1b0;
  uint64_t uStack_1a8;
  int64_t local_1a0;
  int64_t iStack_198;
  bool local_190;
  ConfidentialAssetId local_188;
  undefined8 local_160;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *local_158;
  Amount *local_150;
  AmountMap *local_148;
  Amount *local_140;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  *local_138;
  AmountMap *local_130;
  CoinSelection *local_128;
  UtxoFilter *local_120;
  mapped_type local_118;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>_>_>_>
  local_110;
  string local_e0;
  undefined8 *local_c0;
  _Rb_tree_node_base local_b8;
  size_t local_98;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> local_90;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  Amount local_60;
  ConfidentialAssetId local_58;
  
  uVar2 = option_params->effective_fee_baserate_;
  if (uVar2 == 0) {
    cVar4 = '\0';
  }
  else {
    cfd::core::ConfidentialAssetId::ConfidentialAssetId(&local_58,&option_params->fee_asset_);
    cVar4 = cfd::core::ConfidentialAssetId::IsEmpty();
    local_58._vptr_ConfidentialAssetId = (_func_int **)&PTR__ConfidentialAssetId_002b2ea0;
    if (local_58.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_58.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  if (cVar4 != '\0') {
    local_110._M_impl._0_8_ = "cfd_utxo.cpp";
    local_110._M_impl.super__Rb_tree_header._M_header._M_color = 0x13e;
    local_110._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x267dc5;
    local_290._0_8_ = option_params->effective_fee_baserate_;
    cfd::core::ConfidentialAssetId::ConfidentialAssetId
              ((ConfidentialAssetId *)local_1d0,&option_params->fee_asset_);
    cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_();
    core::logger::log<unsigned_long&,std::__cxx11::string&>
              ((CfdSourceLocation *)&local_110,kCfdLogLevelWarning,
               "Failed to SelectCoins. Fee calculation option error.: effective_fee_base_rate=[{}], fee_asset=[{}]"
               ,(unsigned_long *)local_290,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_228);
    if ((_Base_ptr *)local_228._M_impl._0_8_ !=
        &local_228._M_impl.super__Rb_tree_header._M_header._M_parent) {
      operator_delete((void *)local_228._M_impl._0_8_);
    }
    local_1d0._0_8_ = &PTR__ConfidentialAssetId_002b2ea0;
    if ((void *)CONCAT44(local_1d0._12_4_,local_1d0._8_4_) != (void *)0x0) {
      operator_delete((void *)CONCAT44(local_1d0._12_4_,local_1d0._8_4_));
    }
    pCVar10 = (CfdException *)__cxa_allocate_exception(0x30);
    local_1d0._0_8_ = &local_1c0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1d0,"Failed to SelectCoins. Fee calculation option error.","");
    core::CfdException::CfdException(pCVar10,kCfdIllegalStateError,(string *)local_1d0);
    __cxa_throw(pCVar10,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  if (map_select_value == (AmountMap *)0x0) {
    local_1d0._0_8_ = "cfd_utxo.cpp";
    local_1d0._8_4_ = 0x148;
    local_1c0._M_allocated_capacity = 0x267dc5;
    core::logger::log<>((CfdSourceLocation *)local_1d0,kCfdLogLevelWarning,
                        "Failed to SelectCoins. map_select_value is empty.");
    pCVar10 = (CfdException *)__cxa_allocate_exception(0x30);
    local_1d0._0_8_ = &local_1c0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1d0,"Failed to SelectCoins. map_select_value is empty.","");
    core::CfdException::CfdException(pCVar10,kCfdIllegalStateError,(string *)local_1d0);
    __cxa_throw(pCVar10,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
  ::_Rb_tree(&local_228,&map_target_value->_M_t);
  cfd::core::ConfidentialAssetId::ConfidentialAssetId(&local_1f8);
  local_128 = this;
  local_120 = filter;
  if ((uVar2 != 0) && (option_params->has_ignore_fee_asset_ == false)) {
    cfd::core::ConfidentialAssetId::ConfidentialAssetId
              ((ConfidentialAssetId *)local_1d0,&option_params->fee_asset_);
    cfd::core::ConfidentialAssetId::operator=(&local_1f8,(ConfidentialAssetId *)local_1d0);
    local_1d0._0_8_ = &PTR__ConfidentialAssetId_002b2ea0;
    if ((void *)CONCAT44(local_1d0._12_4_,local_1d0._8_4_) != (void *)0x0) {
      operator_delete((void *)CONCAT44(local_1d0._12_4_,local_1d0._8_4_));
    }
    cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_();
    iVar6 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
            ::find(&local_228,(key_type *)local_1d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._0_8_ != &local_1c0) {
      operator_delete((void *)local_1d0._0_8_);
    }
    if ((_Rb_tree_header *)iVar6._M_node == &local_228._M_impl.super__Rb_tree_header) {
      cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_();
      local_110._M_impl._0_8_ = local_110._M_impl._0_8_ & 0xffffffff00000000;
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,long>,std::_Select1st<std::pair<std::__cxx11::string_const,long>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,long>>>
      ::_M_emplace_unique<std::__cxx11::string,int>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,long>,std::_Select1st<std::pair<std::__cxx11::string_const,long>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,long>>>
                  *)&local_228,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d0,
                 (int *)&local_110);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._0_8_ != &local_1c0) {
        operator_delete((void *)local_1d0._0_8_);
      }
    }
  }
  local_110._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_110._M_impl.super__Rb_tree_header._M_header;
  local_110._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_110._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_110._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_110._M_impl.super__Rb_tree_header._M_header._M_right =
       local_110._M_impl.super__Rb_tree_header._M_header._M_left;
  std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::vector(&local_90,utxos);
  if ((_Rb_tree_header *)local_228._M_impl.super__Rb_tree_header._M_header._M_left !=
      &local_228._M_impl.super__Rb_tree_header) {
    p_Var7 = local_228._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      p_Var1 = p_Var7 + 1;
      cfd::core::ConfidentialAssetId::ConfidentialAssetId
                ((ConfidentialAssetId *)local_1d0,(string *)p_Var1);
      cVar4 = cfd::core::ConfidentialAssetId::IsEmpty();
      if (cVar4 != '\0') {
        local_290._0_8_ = "cfd_utxo.cpp";
        local_290._8_4_ = 0x160;
        local_290._16_8_ = "SelectCoins";
        core::logger::log<>((CfdSourceLocation *)local_290,kCfdLogLevelWarning,
                            "Failed to SelectCoins. Target asset is empty.");
        pCVar10 = (CfdException *)__cxa_allocate_exception(0x30);
        local_290._0_8_ = local_290 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_290,"Failed to SelectCoins. Target asset is empty.","");
        core::CfdException::CfdException(pCVar10,kCfdIllegalStateError,(string *)local_290);
        __cxa_throw(pCVar10,&core::CfdException::typeinfo,core::CfdException::~CfdException);
      }
      local_258 = (undefined1  [8])0x0;
      ppUStack_250 = (Utxo **)0x0;
      local_248 = (_Base_ptr)0x0;
      std::vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>::reserve
                ((vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_> *)local_258,
                 ((long)(utxos->super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>)._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)(utxos->super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>)._M_impl.
                        super__Vector_impl_data._M_start >> 3) * -0x7b425ed097b425ed);
      pUVar3 = local_90.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
               super__Vector_impl_data._M_finish;
      local_260 = p_Var7;
      for (pUVar11 = local_90.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
                     super__Vector_impl_data._M_start; pUVar11 != pUVar3; pUVar11 = pUVar11 + 1) {
        std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char*,void>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_2b0,pUVar11->asset,
                   &pUVar11->field_0xaa,(allocator_type *)local_290);
        cfd::core::ByteData::ByteData((ByteData *)&local_e0,(vector *)&local_2b0);
        cfd::core::ConfidentialAssetId::ConfidentialAssetId
                  ((ConfidentialAssetId *)local_290,(ByteData *)&local_e0);
        cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_();
        p_Var7 = local_260[1]._M_parent;
        if (p_Var7 == (_Base_ptr)CONCAT44(local_b8._4_4_,local_b8._M_color)) {
          if (p_Var7 == (_Base_ptr)0x0) {
            bVar12 = true;
          }
          else {
            iVar5 = bcmp(*(void **)p_Var1,local_c0,(size_t)p_Var7);
            bVar12 = iVar5 == 0;
          }
        }
        else {
          bVar12 = false;
        }
        if ((_Base_ptr *)local_c0 != &local_b8._M_parent) {
          operator_delete(local_c0);
        }
        local_290._0_8_ = &PTR__ConfidentialAssetId_002b2ea0;
        if ((void *)CONCAT44(local_290._12_4_,local_290._8_4_) != (void *)0x0) {
          operator_delete((void *)CONCAT44(local_290._12_4_,local_290._8_4_));
        }
        if (local_e0._M_dataplus._M_p != (pointer)0x0) {
          operator_delete(local_e0._M_dataplus._M_p);
        }
        if (bVar12) {
          local_290._0_8_ = pUVar11;
          if ((_Base_ptr)ppUStack_250 == local_248) {
            std::vector<cfd::Utxo*,std::allocator<cfd::Utxo*>>::_M_realloc_insert<cfd::Utxo*>
                      ((vector<cfd::Utxo*,std::allocator<cfd::Utxo*>> *)local_258,
                       (iterator)ppUStack_250,(Utxo **)local_290);
          }
          else {
            *ppUStack_250 = pUVar11;
            ppUStack_250 = ppUStack_250 + 1;
          }
        }
        if (local_2b0._M_dataplus._M_p != (pointer)0x0) {
          operator_delete(local_2b0._M_dataplus._M_p);
        }
      }
      if ((undefined1  [8])ppUStack_250 == local_258) {
        local_290._0_8_ = "cfd_utxo.cpp";
        local_290._8_4_ = 0x172;
        local_290._16_8_ = "SelectCoins";
        core::logger::log<std::__cxx11::string_const&>
                  ((CfdSourceLocation *)local_290,kCfdLogLevelWarning,
                   "Failed to SelectCoins. Target asset is not found in utxo list.target_asset=[{}]"
                   ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)p_Var1);
        pCVar10 = (CfdException *)__cxa_allocate_exception(0x30);
        local_290._0_8_ = local_290 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_290,
                   "Failed to SelectCoins. Target asset is not found in utxo list.","");
        core::CfdException::CfdException(pCVar10,kCfdIllegalStateError,(string *)local_290);
        __cxa_throw(pCVar10,&core::CfdException::typeinfo,core::CfdException::~CfdException);
      }
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::vector<cfd::Utxo*,std::allocator<cfd::Utxo*>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::vector<cfd::Utxo*,std::allocator<cfd::Utxo*>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<cfd::Utxo*,std::allocator<cfd::Utxo*>>>>>
      ::
      _M_emplace_unique<std::__cxx11::string_const&,std::vector<cfd::Utxo*,std::allocator<cfd::Utxo*>>&>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::vector<cfd::Utxo*,std::allocator<cfd::Utxo*>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::vector<cfd::Utxo*,std::allocator<cfd::Utxo*>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<cfd::Utxo*,std::allocator<cfd::Utxo*>>>>>
                  *)&local_110,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)p_Var1,
                 (vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_> *)local_258);
      p_Var1 = local_260;
      if (local_258 != (undefined1  [8])0x0) {
        operator_delete((void *)local_258);
      }
      local_1d0._0_8_ = &PTR__ConfidentialAssetId_002b2ea0;
      if ((void *)CONCAT44(local_1d0._12_4_,local_1d0._8_4_) != (void *)0x0) {
        operator_delete((void *)CONCAT44(local_1d0._12_4_,local_1d0._8_4_));
      }
      p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var1);
    } while ((_Rb_tree_header *)p_Var7 != &local_228._M_impl.super__Rb_tree_header);
  }
  (__return_storage_ptr__->super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::reserve
            (__return_storage_ptr__,
             ((long)(utxos->super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>)._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(utxos->super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>)._M_impl.
                    super__Vector_impl_data._M_start >> 3) * -0x7b425ed097b425ed);
  local_78 = *(undefined8 *)tx_fee_value;
  uStack_70 = *(undefined8 *)(tx_fee_value + 8);
  local_290._24_8_ = local_290 + 8;
  local_290._8_4_ = _S_red;
  local_290._16_8_ = (_Base_ptr)0x0;
  local_268 = 0;
  local_270 = (_Base_ptr)local_290._24_8_;
  cfd::core::Amount::Amount((Amount *)&local_68);
  local_b8._M_left = &local_b8;
  local_b8._M_color = _S_red;
  local_b8._M_parent = (_Base_ptr)0x0;
  local_98 = 0;
  local_240 = (_Base_ptr)&ppUStack_250;
  ppUStack_250 = (Utxo **)((ulong)ppUStack_250 & 0xffffffff00000000);
  local_248 = (_Base_ptr)0x0;
  local_230 = 0;
  local_1d0._0_8_ = local_128;
  local_1d0._8_4_ = local_120->reserved;
  local_1c0._M_allocated_capacity = *(undefined8 *)option_params;
  local_1c0._8_8_ = *(undefined8 *)&option_params->change_spend_size_;
  local_1b0 = option_params->effective_fee_baserate_;
  uStack_1a8 = option_params->long_term_fee_baserate_;
  local_1a0 = option_params->knapsack_minimum_change_;
  iStack_198 = option_params->dust_fee_rate_;
  local_190 = option_params->has_ignore_fee_asset_;
  local_238 = local_240;
  local_b8._M_right = local_b8._M_left;
  cfd::core::ConfidentialAssetId::ConfidentialAssetId(&local_188,&option_params->fee_asset_);
  local_160._0_4_ = option_params->exponent_;
  local_160._4_4_ = option_params->minimum_bits_;
  local_150 = (Amount *)&local_78;
  local_148 = (AmountMap *)local_290;
  local_138 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
               *)&local_c0;
  local_130 = (AmountMap *)local_258;
  local_158 = __return_storage_ptr__;
  local_140 = (Amount *)&local_68;
  if ((_Rb_tree_header *)local_228._M_impl.super__Rb_tree_header._M_header._M_left !=
      &local_228._M_impl.super__Rb_tree_header) {
    p_Var7 = local_228._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_();
      p_Var1 = p_Var7 + 1;
      __n = p_Var7[1]._M_parent;
      if (__n == (_Base_ptr)local_2b0._M_string_length) {
        if (__n == (_Base_ptr)0x0) {
          bVar12 = true;
        }
        else {
          iVar5 = bcmp(*(void **)p_Var1,local_2b0._M_dataplus._M_p,(size_t)__n);
          bVar12 = iVar5 == 0;
        }
      }
      else {
        bVar12 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
        operator_delete(local_2b0._M_dataplus._M_p);
      }
      if (!bVar12) {
        pmVar8 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>_>_>_>
                               *)&local_110,(key_type *)p_Var1);
        cfd::core::Amount::Amount((Amount *)&local_2b0);
        SelectCoins::anon_class_168_9_d2d4f853::operator()
                  ((anon_class_168_9_d2d4f853 *)local_1d0,(int64_t *)(p_Var7 + 2),pmVar8,
                   (Amount *)&local_2b0,(string *)p_Var1,false);
      }
      p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
    } while ((_Rb_tree_header *)p_Var7 != &local_228._M_impl.super__Rb_tree_header);
  }
  if ((uVar2 != 0) && (option_params->has_ignore_fee_asset_ == false)) {
    cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_();
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                           *)&local_228,&local_2b0);
    local_118 = *pmVar9;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
      operator_delete(local_2b0._M_dataplus._M_p);
    }
    cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_();
    pmVar8 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>_>_>_>
                           *)&local_110,&local_2b0);
    cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_();
    SelectCoins::anon_class_168_9_d2d4f853::operator()
              ((anon_class_168_9_d2d4f853 *)local_1d0,&local_118,pmVar8,(Amount *)&local_78,
               &local_e0,true);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
      operator_delete(local_2b0._M_dataplus._M_p);
    }
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
  ::operator=(&map_select_value->_M_t,
              (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
               *)local_290);
  if (utxo_fee_value != (Amount *)0x0) {
    utxo_fee_value[8] = local_60;
    *(undefined8 *)utxo_fee_value = local_68;
  }
  if (map_searched_bnb !=
      (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
       *)0x0) {
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
    ::operator=(&map_searched_bnb->_M_t,
                (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                 *)&local_c0);
  }
  if (map_utxo_fee_value != (AmountMap *)0x0) {
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
    ::operator=(&map_utxo_fee_value->_M_t,
                (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                 *)local_258);
  }
  local_188._vptr_ConfidentialAssetId = (_func_int **)&PTR__ConfidentialAssetId_002b2ea0;
  if (local_188.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_188.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
               *)local_258);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
               *)&local_c0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
               *)local_290);
  if (local_90.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
      super__Vector_impl_data._M_start != (Utxo *)0x0) {
    operator_delete(local_90.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>_>_>_>
  ::~_Rb_tree(&local_110);
  local_1f8._vptr_ConfidentialAssetId = (_func_int **)&PTR__ConfidentialAssetId_002b2ea0;
  if (local_1f8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1f8.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
  ::~_Rb_tree(&local_228);
  return __return_storage_ptr__;
}

Assistant:

std::vector<Utxo> CoinSelection::SelectCoins(
    const AmountMap& map_target_value, const std::vector<Utxo>& utxos,
    const UtxoFilter& filter, const CoinSelectionOption& option_params,
    const Amount& tx_fee_value, AmountMap* map_select_value,
    Amount* utxo_fee_value, std::map<std::string, bool>* map_searched_bnb,
    AmountMap* map_utxo_fee_value) {
  bool calculate_fee = (option_params.GetEffectiveFeeBaserate() != 0);
  if (calculate_fee && option_params.GetFeeAsset().IsEmpty()) {
    warn(
        CFD_LOG_SOURCE,
        "Failed to SelectCoins. Fee calculation option error."
        ": effective_fee_base_rate=[{}], fee_asset=[{}]",
        option_params.GetEffectiveFeeBaserate(),
        option_params.GetFeeAsset().GetHex());
    throw CfdException(
        CfdError::kCfdIllegalStateError,
        "Failed to SelectCoins. Fee calculation option error.");
  }
  if (map_select_value == nullptr) {
    warn(CFD_LOG_SOURCE, "Failed to SelectCoins. map_select_value is empty.");
    throw CfdException(
        CfdError::kCfdIllegalStateError,
        "Failed to SelectCoins. map_select_value is empty.");
  }

  // add fee asset to target asset list
  AmountMap work_target_values = map_target_value;
  ConfidentialAssetId fee_asset;
  if (calculate_fee && (!option_params.HasIgnoreFeeAsset())) {
    fee_asset = option_params.GetFeeAsset();
    auto iter = work_target_values.find(fee_asset.GetHex());
    if (iter == std::end(work_target_values)) {
      work_target_values.emplace(fee_asset.GetHex(), 0);
    }
  }

  // asset exists check
  std::map<std::string, std::vector<Utxo*>> asset_utxos;
  std::vector<Utxo> work_utxos = utxos;
  for (auto& target : work_target_values) {
    // asset valid check...
    ConfidentialAssetId target_asset(target.first);
    if (target_asset.IsEmpty()) {
      warn(CFD_LOG_SOURCE, "Failed to SelectCoins. Target asset is empty.");
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "Failed to SelectCoins. Target asset is empty.");
    }

    // convert utxo list to ptr
    std::vector<Utxo*> p_utxos;
    p_utxos.reserve(utxos.size());
    for (auto& utxo : work_utxos) {
      std::vector<uint8_t> asset_byte(
          std::begin(utxo.asset), std::end(utxo.asset));
      if (target.first == ConfidentialAssetId(asset_byte).GetHex()) {
        p_utxos.push_back(&utxo);
      }
    }
    if (p_utxos.size() == 0) {
      warn(
          CFD_LOG_SOURCE,
          "Failed to SelectCoins. Target asset is not found in utxo list."
          "target_asset=[{}]",
          target.first);
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "Failed to SelectCoins. Target asset is not found in utxo list.");
    }

    asset_utxos.emplace(target.first, p_utxos);
  }

  // coin selection function
  std::vector<Utxo> result;
  result.reserve(utxos.size());
  Amount tx_fee_out = tx_fee_value;
  AmountMap work_selected_values;
  Amount work_utxo_fee = Amount();
  std::map<std::string, bool> work_searched_bnb;
  AmountMap work_map_utxo_fee_value;
  auto coin_selection_function = [this, filter, option_params, &result,
                                  &tx_fee_out, &work_selected_values,
                                  &work_utxo_fee, &work_searched_bnb,
                                  &work_map_utxo_fee_value](
                                     const int64_t& target_value,
                                     const std::vector<Utxo*>& utxos,
                                     const Amount& tx_fee,
                                     const std::string& asset_id,
                                     bool consider_fee) {
    int64_t select_value_out = 0;
    Amount utxo_fee_out = Amount();
    bool use_bnb_out = false;
    std::vector<Utxo> ret_utxos = SelectCoinsMinConf(
        target_value, utxos, filter, option_params, tx_fee, consider_fee,
        &select_value_out, &utxo_fee_out, &use_bnb_out);
    std::copy(ret_utxos.begin(), ret_utxos.end(), std::back_inserter(result));
    tx_fee_out += utxo_fee_out;
    work_utxo_fee += utxo_fee_out;
    work_selected_values.emplace(asset_id, select_value_out);
    work_searched_bnb.emplace(asset_id, use_bnb_out);
    work_map_utxo_fee_value.emplace(asset_id, utxo_fee_out.GetSatoshiValue());
  };

  // do coin selection exclude fee asset
  for (auto& target : work_target_values) {
    // skip fee asset
    if (target.first == fee_asset.GetHex()) {
      continue;
    }

    // For assets other than fees, calculate without considering fees.
    const auto& target_value = target.second;
    coin_selection_function(
        target_value, asset_utxos[target.first], Amount(), target.first,
        false);
  }

  // do coin selection with fee asset
  if (calculate_fee && (!option_params.HasIgnoreFeeAsset())) {
    int64_t target_value = work_target_values[fee_asset.GetHex()];
    coin_selection_function(
        target_value, asset_utxos[fee_asset.GetHex()], tx_fee_out,
        fee_asset.GetHex(), true);
  }

  if (map_select_value != nullptr) {
    *map_select_value = work_selected_values;
  }
  if (utxo_fee_value != nullptr) {
    *utxo_fee_value = work_utxo_fee;
  }
  if (map_searched_bnb != nullptr) {
    *map_searched_bnb = work_searched_bnb;
  }
  if (map_utxo_fee_value != nullptr) {
    *map_utxo_fee_value = work_map_utxo_fee_value;
  }
  return result;
}